

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Imputer::MergeFrom(Imputer *this,Imputer *from)

{
  uint32 uVar1;
  void *pvVar2;
  ReplaceValueUnion RVar3;
  LogMessage *other;
  Int64Vector *this_00;
  DoubleVector *pDVar4;
  StringToDoubleMap *this_01;
  Int64ToDoubleMap *this_02;
  Int64Vector *from_00;
  DoubleVector *from_01;
  StringToDoubleMap *from_02;
  Int64ToDoubleMap *from_03;
  ImputedValueUnion IVar5;
  LogFinisher local_59;
  ImputedValueUnion local_58;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/Imputer.pb.cc"
               ,0x266);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    IVar5 = from->ImputedValue_;
    if (this->_oneof_case_[0] != 1) {
      local_58 = from->ImputedValue_;
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 1;
      IVar5 = local_58;
    }
    this->ImputedValue_ = IVar5;
    break;
  case 2:
    IVar5 = from->ImputedValue_;
    if (this->_oneof_case_[0] != 2) {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 2;
    }
    this->ImputedValue_ = IVar5;
    break;
  case 3:
    pDVar4 = (from->ImputedValue_).imputeddoublearray_;
    if (this->_oneof_case_[0] == 3) {
      if ((this->ImputedValue_).imputeddoublearray_ !=
          (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        std::__cxx11::string::_M_assign((string *)(this->ImputedValue_).imputeddoublearray_);
        break;
      }
    }
    else {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 3;
      (this->ImputedValue_).imputeddoublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->ImputedValue_).imputedstringvalue_,(string *)pDVar4);
    break;
  case 4:
    if (this->_oneof_case_[0] == 4) {
      pDVar4 = (this->ImputedValue_).imputeddoublearray_;
LAB_001cf77d:
      from_01 = (from->ImputedValue_).imputeddoublearray_;
    }
    else {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 4;
      pDVar4 = (DoubleVector *)operator_new(0x28);
      DoubleVector::DoubleVector(pDVar4);
      (this->ImputedValue_).imputeddoublearray_ = pDVar4;
      if (from->_oneof_case_[0] == 4) goto LAB_001cf77d;
      from_01 = DoubleVector::default_instance();
    }
    DoubleVector::MergeFrom(pDVar4,from_01);
    break;
  case 5:
    if (this->_oneof_case_[0] == 5) {
      this_00 = (this->ImputedValue_).imputedint64array_;
LAB_001cf716:
      from_00 = (from->ImputedValue_).imputedint64array_;
    }
    else {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 5;
      this_00 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(this_00);
      (this->ImputedValue_).imputedint64array_ = this_00;
      if (from->_oneof_case_[0] == 5) goto LAB_001cf716;
      from_00 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_00,from_00);
    break;
  case 6:
    if (this->_oneof_case_[0] == 6) {
      this_01 = (this->ImputedValue_).imputedstringdictionary_;
LAB_001cf7b5:
      from_02 = (from->ImputedValue_).imputedstringdictionary_;
    }
    else {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 6;
      this_01 = (StringToDoubleMap *)operator_new(0x38);
      StringToDoubleMap::StringToDoubleMap(this_01);
      (this->ImputedValue_).imputedstringdictionary_ = this_01;
      if (from->_oneof_case_[0] == 6) goto LAB_001cf7b5;
      from_02 = StringToDoubleMap::default_instance();
    }
    StringToDoubleMap::MergeFrom(this_01,from_02);
    break;
  case 7:
    if (this->_oneof_case_[0] == 7) {
      this_02 = (this->ImputedValue_).imputedint64dictionary_;
LAB_001cf7ea:
      from_03 = (from->ImputedValue_).imputedint64dictionary_;
    }
    else {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 7;
      this_02 = (Int64ToDoubleMap *)operator_new(0x38);
      Int64ToDoubleMap::Int64ToDoubleMap(this_02);
      (this->ImputedValue_).imputedint64dictionary_ = this_02;
      if (from->_oneof_case_[0] == 7) goto LAB_001cf7ea;
      from_03 = Int64ToDoubleMap::default_instance();
    }
    Int64ToDoubleMap::MergeFrom(this_02,from_03);
  }
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0xd) {
    RVar3 = from->ReplaceValue_;
    if (this->_oneof_case_[1] == 0xd) {
      if ((string *)(this->ReplaceValue_).replaceint64value_ !=
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        std::__cxx11::string::_M_assign((string *)(this->ReplaceValue_).replaceint64value_);
        return;
      }
    }
    else {
      clear_ReplaceValue(this);
      this->_oneof_case_[1] = 0xd;
      (this->ReplaceValue_).replacedoublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->ReplaceValue_).replacestringvalue_,(string *)RVar3);
  }
  else if (uVar1 == 0xc) {
    RVar3 = from->ReplaceValue_;
    if (this->_oneof_case_[1] != 0xc) {
      clear_ReplaceValue(this);
      this->_oneof_case_[1] = 0xc;
    }
    this->ReplaceValue_ = RVar3;
  }
  else if (uVar1 == 0xb) {
    local_58 = *(ImputedValueUnion *)&from->ReplaceValue_;
    if (this->_oneof_case_[1] != 0xb) {
      clear_ReplaceValue(this);
      this->_oneof_case_[1] = 0xb;
    }
    this->ReplaceValue_ = (ReplaceValueUnion)local_58;
  }
  return;
}

Assistant:

void Imputer::MergeFrom(const Imputer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Imputer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      set_imputeddoublevalue(from.imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      set_imputedint64value(from.imputedint64value());
      break;
    }
    case kImputedStringValue: {
      set_imputedstringvalue(from.imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from.imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from.imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from.imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from.imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      set_replacedoublevalue(from.replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      set_replaceint64value(from.replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      set_replacestringvalue(from.replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
}